

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O3

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::Verify
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,bool pendingDispose)

{
  HeapBlockType *corruptedAddress;
  HeapBlockType HVar1;
  ushort uVar2;
  undefined4 *puVar3;
  FreeObject *pFVar4;
  char *pcVar5;
  code *pcVar6;
  anon_class_32_4_66517344 fn;
  Type *pTVar7;
  bool bVar8;
  BOOLEAN BVar9;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *pSVar10;
  FreeObject *pFVar11;
  HeapBlock *pHVar12;
  ulong uVar13;
  byte *pbVar14;
  undefined7 in_register_00000031;
  uint index;
  uint uVar15;
  FreeObject *this_00;
  BVIndex i;
  undefined8 *in_FS_OFFSET;
  undefined1 local_290 [8];
  SmallHeapBlockBitVector tempFree;
  SmallHeapBlockBitVector tempPending;
  HeapBlock *local_58;
  SmallHeapBlockBitVector *free;
  HeapBlock *local_48;
  undefined4 *local_40;
  uint local_38;
  ushort local_32 [4];
  ushort verifyFinalizeCount;
  
  local_32[0] = 0;
  memset((HeapBlock *)local_290,0,0x100);
  local_58 = (HeapBlock *)local_290;
  memset(tempFree.data + 0x1f,0,0x100);
  BuildFreeBitVector(this,(SmallHeapBlockBitVector *)local_290);
  this_00 = (FreeObject *)(this->super_HeapBlock).address;
  uVar15 = 1;
  if ((((int)CONCAT71(in_register_00000031,pendingDispose) != 0) &&
      (HVar1 = (this->super_HeapBlock).heapBlockType, HVar1 != SmallFinalizableBlockType)) &&
     (HVar1 != MediumFinalizableBlockType)) {
    uVar15 = (uint)(HVar1 == MediumFinalizableBlockWithBarrierType ||
                   HVar1 == MediumAllocBlockTypeCount);
  }
  uVar2 = this->objectSize;
  free = (SmallHeapBlockBitVector *)this->heapBucket->heapInfo->recycler;
  corruptedAddress = &(this->super_HeapBlock).heapBlockType;
  Recycler::VerifyCheck
            (uVar15,L"Non-finalizable block shouldn\'t be disposing. May have corrupted block type."
             ,this_00,corruptedAddress);
  uVar15 = (uint)(this->super_HeapBlock).heapBlockType;
  if (((uVar15 < 0xb) && ((0x528U >> (uVar15 & 0x1f) & 1) != 0)) &&
     (pSVar10 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>
                          (&this->super_HeapBlock), pSVar10->pendingDisposeCount != 0)) {
    if (!pendingDispose) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)*in_FS_OFFSET;
      *puVar3 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0x825,"(pendingDispose)","pendingDispose");
      if (!bVar8) goto LAB_0020ed69;
      *puVar3 = 0;
    }
    pSVar10 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>(&this->super_HeapBlock)
    ;
    fn.free = (SmallHeapBlockBitVector **)&local_58;
    fn.this = this;
    fn.tempPending = (SmallHeapBlockBitVector *)(tempFree.data + 0x1f);
    fn.verifyFinalizeCount = local_32;
    SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::
    ForEachPendingDisposeObject<Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::Verify(bool)::_lambda(unsigned_int)_1_>
              (pSVar10,fn);
  }
  if (this->objectCount != 0) {
    uVar15 = (uint)(uVar2 >> 4);
    local_40 = (undefined4 *)*in_FS_OFFSET;
    pTVar7 = free->data;
    i = 0;
    index = 0;
    local_38 = uVar15;
    do {
      BVar9 = BVStatic<2048UL>::Test((BVStatic<2048UL> *)local_58,i);
      if (BVar9 == '\0') {
        BVar9 = BVStatic<2048UL>::Test(&this->explicitFreeBits,i);
        if (BVar9 == '\0') {
          Recycler::VerifyCheckPad((Recycler *)free,this_00,(ulong)this->objectSize);
        }
        else {
          pFVar11 = FreeObject::GetNext(this_00);
          uVar15 = 1;
          if (pFVar11 != (FreeObject *)0x0) {
            if (((ulong)pFVar11 & 0xf) == 0 && (FreeObject *)0xffff < pFVar11) {
              pHVar12 = HeapBlockMap64::GetHeapBlock((HeapBlockMap64 *)(pTVar7 + 6),pFVar11);
            }
            else {
              pHVar12 = (HeapBlock *)0x0;
            }
            pFVar4 = (FreeObject *)(this->super_HeapBlock).address;
            if (pFVar11 < pFVar4 + 0x1000 && pFVar4 <= pFVar11) {
              local_48 = pHVar12;
              if (((ulong)pFVar11 & 0xf) != 0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *local_40 = 1;
                bVar8 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                                   ,0x24d,"(HeapInfo::IsAlignedAddress(objectAddress))",
                                   "HeapInfo::IsAlignedAddress(objectAddress)");
                if (!bVar8) goto LAB_0020ed69;
                *local_40 = 0;
              }
              BVar9 = BVStatic<2048UL>::Test
                                (&this->explicitFreeBits,(uint)((ulong)pFVar11 >> 4) & 0x7ff);
              uVar15 = 1;
              pHVar12 = local_48;
              if (BVar9 != '\0') goto LAB_0020ec14;
            }
            uVar13 = (**(code **)(((Type *)&pHVar12->_vptr_HeapBlock)->word + 0x48))
                               (pHVar12,pFVar11);
            uVar15 = (uint)(uVar13 == this->objectSize);
          }
LAB_0020ec14:
          Recycler::VerifyCheck
                    (uVar15,L"SmallHeapBlock memory written to after freed",this_00,this_00);
          Recycler::VerifyCheckPadExplicitFreeList((Recycler *)free,this_00,(ulong)this->objectSize)
          ;
          uVar15 = local_38;
        }
        pbVar14 = ObjectInfo(this,index);
        if ((char)*pbVar14 < '\0') {
          if ((*corruptedAddress < 0xb) && ((0x528U >> (*corruptedAddress & 0x1f) & 1) != 0)) {
            local_32[0] = local_32[0] + 1;
          }
          else {
            pcVar5 = (this->super_HeapBlock).address;
            pbVar14 = ObjectInfo(this,index);
            uVar15 = local_38;
            Recycler::VerifyCheck
                      (0,L"Non-Finalizable block should not have finalizable objects",pcVar5,pbVar14
                      );
          }
        }
      }
      else {
        BVar9 = BVStatic<2048UL>::Test((BVStatic<2048UL> *)(tempFree.data + 0x1f),i);
        if (BVar9 == '\0') {
          pFVar11 = FreeObject::GetNext(this_00);
          if (pFVar11 == (FreeObject *)0x0) {
            uVar15 = 1;
          }
          else {
            pFVar4 = (FreeObject *)(this->super_HeapBlock).address;
            uVar15 = 0;
            if (pFVar11 < pFVar4 + 0x1000 && pFVar4 <= pFVar11) {
              pHVar12 = local_58;
              if (((ulong)pFVar11 & 0xf) != 0) {
                local_48 = local_58;
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *local_40 = 1;
                bVar8 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                                   ,0x24d,"(HeapInfo::IsAlignedAddress(objectAddress))",
                                   "HeapInfo::IsAlignedAddress(objectAddress)");
                if (!bVar8) goto LAB_0020ed69;
                *local_40 = 0;
                pHVar12 = local_48;
              }
              BVar9 = BVStatic<2048UL>::Test
                                ((BVStatic<2048UL> *)pHVar12,(uint)((ulong)pFVar11 >> 4) & 0x7ff);
              uVar15 = (uint)(BVar9 != '\0');
            }
          }
          Recycler::VerifyCheck
                    (uVar15,L"SmallHeapBlock memory written to after freed",this_00,this_00);
          Recycler::VerifyCheckFill(this_00 + 1,(ulong)this->objectSize - 8);
          uVar15 = local_38;
        }
      }
      this_00 = (FreeObject *)((long)&this_00->taggedNext + (ulong)this->objectSize);
      index = index + 1;
      i = i + uVar15;
    } while (index < this->objectCount);
  }
  if ((*corruptedAddress < 0xb) && ((0x528U >> (*corruptedAddress & 0x1f) & 1) != 0)) {
    pSVar10 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>(&this->super_HeapBlock)
    ;
    bVar8 = pSVar10->finalizeCount == local_32[0];
    pcVar5 = (this->super_HeapBlock).address;
    pSVar10 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>(&this->super_HeapBlock)
    ;
    Recycler::VerifyCheck
              ((uint)bVar8,L"SmallHeapBlock finalize count mismatch",pcVar5,&pSVar10->finalizeCount)
    ;
  }
  else if (local_32[0] != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x876,"(verifyFinalizeCount == 0)","verifyFinalizeCount == 0");
    if (!bVar8) {
LAB_0020ed69:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

void SmallHeapBlockT<TBlockAttributes>::Verify(bool pendingDispose)
{
    ushort verifyFinalizeCount = 0;
    SmallHeapBlockBitVector tempFree;
    SmallHeapBlockBitVector *free = &tempFree;
    SmallHeapBlockBitVector tempPending;
    this->BuildFreeBitVector(free);
    Recycler * recycler = this->heapBucket->heapInfo->recycler;
    char * memBlock = this->GetAddress();
    uint objectBitDelta = this->GetObjectBitDelta();
    Recycler::VerifyCheck(!pendingDispose || this->IsAnyFinalizableBlock(),
        _u("Non-finalizable block shouldn't be disposing. May have corrupted block type."),
        this->GetAddress(), (void *)&this->heapBlockType);

    if (HasPendingDisposeObjects())
    {
        Assert(pendingDispose);

        // Pending object are not free yet, they don't have memory cleared.
        this->AsFinalizableBlock<TBlockAttributes>()->ForEachPendingDisposeObject([&](uint index) {

            uint bitIndex = ((uint)index) * this->GetObjectBitDelta();
            Assert(IsValidBitIndex(bitIndex));
            Assert(!this->GetDebugFreeBitVector()->Test(bitIndex));
            Assert(free->Test(bitIndex));

            tempPending.Set(bitIndex);

            // We are a pending dispose block, so the finalize count hasn't been update yet.
            // Including the pending objects in the finalize count
            verifyFinalizeCount++;
        });
    }

    for (uint i = 0; i < objectCount; i++)
    {
        if (free->Test(i * objectBitDelta))
        {
            if (!tempPending.Test(i * objectBitDelta))
            {
                char * nextFree = (char *)((FreeObject *)memBlock)->GetNext();
                Recycler::VerifyCheck(nextFree == nullptr
                    || (nextFree >= address && nextFree < this->GetEndAddress()
                    && free->Test(GetAddressBitIndex(nextFree))),
                    _u("SmallHeapBlock memory written to after freed"), memBlock, memBlock);
                Recycler::VerifyCheckFill(memBlock + sizeof(FreeObject), this->GetObjectSize() - sizeof(FreeObject));
            }
        }
        else
        {
            if (explicitFreeBits.Test(i * objectBitDelta))
            {
                char * nextFree = (char *)((FreeObject *)memBlock)->GetNext();

                HeapBlock* nextFreeHeapBlock = this;

                if (nextFree != nullptr)
                {
                    nextFreeHeapBlock = recycler->FindHeapBlock(nextFree);
                }

                Recycler::VerifyCheck(nextFree == nullptr
                    || (nextFree >= address && nextFree < this->GetEndAddress()
                    && explicitFreeBits.Test(GetAddressBitIndex(nextFree)))
                    || nextFreeHeapBlock->GetObjectSize(nextFree) == this->objectSize,
                    _u("SmallHeapBlock memory written to after freed"), memBlock, memBlock);
                recycler->VerifyCheckPadExplicitFreeList(memBlock, this->GetObjectSize());
            }
            else
            {
                recycler->VerifyCheckPad(memBlock, this->GetObjectSize());
            }

            if ((this->ObjectInfo(i) & FinalizeBit) != 0)
            {
                if (this->IsAnyFinalizableBlock())
                {
                    verifyFinalizeCount++;
                }
                else
                {
                    Recycler::VerifyCheck(false, _u("Non-Finalizable block should not have finalizable objects"),
                        this->GetAddress(), &this->ObjectInfo(i));
                }
            }

        }
        memBlock += this->GetObjectSize();
    }

    if (this->IsAnyFinalizableBlock())
    {
        Recycler::VerifyCheck(this->AsFinalizableBlock<TBlockAttributes>()->finalizeCount == verifyFinalizeCount,
            _u("SmallHeapBlock finalize count mismatch"), this->GetAddress(), &this->AsFinalizableBlock<TBlockAttributes>()->finalizeCount);
    }
    else
    {
        Assert(verifyFinalizeCount == 0);
    }
}